

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

time_t Time::timeGM(tm *tm)

{
  int iVar1;
  tm *local_38;
  time_t t;
  int nleapdays;
  int y;
  tm *tm_local;
  
  if ((uint)tm->tm_mon < 0xc) {
    if (tm->tm_year < 0x46) {
      tm_local = (tm *)0xffffffffffffffff;
    }
    else {
      iVar1 = (tm->tm_year + 0x76c) - (uint)(tm->tm_mon < 2);
      tm->tm_yday = (uint)timeGM::moff[tm->tm_mon] + tm->tm_mday + -1;
      local_38 = (tm *)(((((long)(tm->tm_year + -0x46) * 0x16d + (long)tm->tm_yday +
                          (long)((iVar1 / 4 - iVar1 / 100) + iVar1 / 400 + -0x1dd)) * 0x18 +
                         (long)tm->tm_hour) * 0x3c + (long)tm->tm_min) * 0x3c + (long)tm->tm_sec);
      if ((long)local_38 < 0) {
        local_38 = (tm *)0xffffffffffffffff;
      }
      tm_local = local_38;
    }
  }
  else {
    tm_local = (tm *)0xffffffffffffffff;
  }
  return (time_t)tm_local;
}

Assistant:

static time_t timeGM(struct tm * tm)
    {
        // Common cummulative year days before the given month
        static const unsigned short moff[12] = { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334 };

        if ((unsigned)tm->tm_mon >= 12) return (time_t)-1;
        
        if (tm->tm_year < 70)
            return (time_t) -1;

        int y = tm->tm_year + 1900 - (tm->tm_mon < 2);
        
        int nleapdays = y / 4 - y / 100 + y / 400 - (1969 / 4 - 1969 / 100 + 1969 / 400);
        tm->tm_yday = moff[tm->tm_mon] + tm->tm_mday - 1; // Fix up tm_yday
        
        time_t t = ((((time_t) (tm->tm_year - 70) * 365 + tm->tm_yday + nleapdays) * 24 +
            tm->tm_hour) * 60 + tm->tm_min) * 60 + tm->tm_sec;

        return (t < 0 ? (time_t)-1 : t);
    }